

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cc
# Opt level: O2

size_t muduo::detail::convert<unsigned_long>(char *buf,unsigned_long value)

{
  bool bVar1;
  size_t sVar2;
  
  sVar2 = 0;
  do {
    buf[sVar2] = *(char *)(zero + value % 10);
    sVar2 = sVar2 + 1;
    bVar1 = 9 < value;
    value = value / 10;
  } while (bVar1);
  buf[sVar2] = '\0';
  std::__reverse<char*>(buf,buf + sVar2);
  return sVar2;
}

Assistant:

size_t convert(char buf[], T value)
{
  T i = value;
  char* p = buf;

  do
  {
    int lsd = static_cast<int>(i % 10);
    i /= 10;
    *p++ = zero[lsd];
  } while (i != 0);

  if (value < 0)
  {
    *p++ = '-';
  }
  *p = '\0';
  std::reverse(buf, p);

  return p - buf;
}